

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_order.cpp
# Opt level: O0

unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true> __thiscall
duckdb::PhysicalOrder::GetLocalSourceState
          (PhysicalOrder *this,ExecutionContext *context,GlobalSourceState *gstate_p)

{
  PhysicalOrderGlobalSourceState *args;
  unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_> in_RDI;
  PhysicalOrderGlobalSourceState *gstate;
  unique_ptr<duckdb::PhysicalOrderLocalSourceState,_std::default_delete<duckdb::PhysicalOrderLocalSourceState>_>
  *in_stack_ffffffffffffffb8;
  __uniq_ptr_impl<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_> this_00;
  
  this_00._M_t.
  super__Tuple_impl<0UL,_duckdb::LocalSourceState_*,_std::default_delete<duckdb::LocalSourceState>_>
  .super__Head_base<0UL,_duckdb::LocalSourceState_*,_false>._M_head_impl =
       (tuple<duckdb::LocalSourceState_*,_std::default_delete<duckdb::LocalSourceState>_>)
       (tuple<duckdb::LocalSourceState_*,_std::default_delete<duckdb::LocalSourceState>_>)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LocalSourceState_*,_std::default_delete<duckdb::LocalSourceState>_>
       .super__Head_base<0UL,_duckdb::LocalSourceState_*,_false>._M_head_impl;
  args = GlobalSourceState::Cast<duckdb::PhysicalOrderGlobalSourceState>
                   ((GlobalSourceState *)
                    in_RDI._M_t.
                    super___uniq_ptr_impl<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::LocalSourceState_*,_std::default_delete<duckdb::LocalSourceState>_>
                    .super__Head_base<0UL,_duckdb::LocalSourceState_*,_false>._M_head_impl);
  make_uniq<duckdb::PhysicalOrderLocalSourceState,duckdb::PhysicalOrderGlobalSourceState&>(args);
  unique_ptr<duckdb::LocalSourceState,std::default_delete<duckdb::LocalSourceState>,true>::
  unique_ptr<duckdb::PhysicalOrderLocalSourceState,std::default_delete<std::unique_ptr<duckdb::LocalSourceState,std::default_delete<duckdb::LocalSourceState>>>,void>
            ((unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>
              *)this_00._M_t.
                super__Tuple_impl<0UL,_duckdb::LocalSourceState_*,_std::default_delete<duckdb::LocalSourceState>_>
                .super__Head_base<0UL,_duckdb::LocalSourceState_*,_false>._M_head_impl,
             in_stack_ffffffffffffffb8);
  unique_ptr<duckdb::PhysicalOrderLocalSourceState,_std::default_delete<duckdb::PhysicalOrderLocalSourceState>,_true>
  ::~unique_ptr((unique_ptr<duckdb::PhysicalOrderLocalSourceState,_std::default_delete<duckdb::PhysicalOrderLocalSourceState>,_true>
                 *)0x184de2c);
  return (unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>)
         (__uniq_ptr_impl<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LocalSourceState_*,_std::default_delete<duckdb::LocalSourceState>_>
         .super__Head_base<0UL,_duckdb::LocalSourceState_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<LocalSourceState> PhysicalOrder::GetLocalSourceState(ExecutionContext &context,
                                                                GlobalSourceState &gstate_p) const {
	auto &gstate = gstate_p.Cast<PhysicalOrderGlobalSourceState>();
	return make_uniq<PhysicalOrderLocalSourceState>(gstate);
}